

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O2

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::ParseRootNode
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  while( true ) {
    iVar2 = (*xmlReader->_vptr_IIrrXMLReader[2])(xmlReader);
    if ((char)iVar2 == '\0') break;
    iVar2 = (*xmlReader->_vptr_IIrrXMLReader[3])(xmlReader);
    if (iVar2 == 1) {
      iVar2 = (*xmlReader->_vptr_IIrrXMLReader[0xd])(xmlReader);
      bVar1 = std::operator==((char *)CONCAT44(extraout_var,iVar2),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              XmlTag::RELS_RELATIONSHIP_NODE_abi_cxx11_);
      if (bVar1) {
        ParseChildNode(this,xmlReader);
      }
    }
  }
  return;
}

Assistant:

void ParseRootNode(XmlReader* xmlReader)
    {       
        ParseAttributes(xmlReader);

        while(xmlReader->read())
        {
            if(xmlReader->getNodeType() == irr::io::EXN_ELEMENT &&
               xmlReader->getNodeName() == XmlTag::RELS_RELATIONSHIP_NODE)
            {
                ParseChildNode(xmlReader);
            }
        }
    }